

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_deviation_free(lys_module *module,lys_deviation *dev,
                       _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  ly_ctx *ctx_00;
  lys_node *plVar1;
  lys_node *plVar2;
  lys_node *local_48;
  lys_node *elem;
  lys_node *next;
  ly_ctx *ctx;
  int local_28;
  int k;
  int j;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_deviation *dev_local;
  lys_module *module_local;
  
  ctx_00 = module->ctx;
  lydict_remove(ctx_00,dev->target_name);
  lydict_remove(ctx_00,dev->dsc);
  lydict_remove(ctx_00,dev->ref);
  lys_extension_instances_free(ctx_00,dev->ext,(uint)dev->ext_size,private_destructor);
  if (dev->deviate != (lys_deviate *)0x0) {
    if (dev->orig_node != (lys_node *)0x0) {
      if (dev->deviate->mod == LY_DEVIATE_NO) {
        local_48 = dev->orig_node;
        while (local_48 != (lys_node *)0x0) {
          local_48->module = module;
          if ((local_48->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            elem = local_48->child;
          }
          else {
            elem = (lys_node *)0x0;
          }
          if (elem == (lys_node *)0x0) {
            if (local_48 == dev->orig_node) break;
            elem = local_48->next;
          }
          while (elem == (lys_node *)0x0) {
            if (local_48->parent->nodetype == LYS_AUGMENT) {
              local_48 = local_48->parent->prev;
            }
            else {
              local_48 = local_48->parent;
            }
            plVar1 = lys_parent(local_48);
            plVar2 = lys_parent(dev->orig_node);
            if (plVar1 == plVar2) break;
            elem = local_48->next;
          }
          local_48 = elem;
        }
        lys_node_free(dev->orig_node,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
      }
      else {
        dev->orig_node->module = module;
        lys_node_free(dev->orig_node,(_func_void_lys_node_ptr_void_ptr *)0x0,1);
      }
    }
    for (k = 0; k < (int)(uint)dev->deviate_size; k = k + 1) {
      lys_extension_instances_free
                (ctx_00,dev->deviate[k].ext,(uint)dev->deviate[k].ext_size,private_destructor);
      for (local_28 = 0; local_28 < (int)(uint)dev->deviate[k].dflt_size; local_28 = local_28 + 1) {
        lydict_remove(ctx_00,dev->deviate[k].dflt[local_28]);
      }
      free(dev->deviate[k].dflt);
      lydict_remove(ctx_00,dev->deviate[k].units);
      if (dev->deviate[k].mod == LY_DEVIATE_DEL) {
        for (local_28 = 0; local_28 < (int)(uint)dev->deviate[k].must_size; local_28 = local_28 + 1)
        {
          lys_restr_free(ctx_00,dev->deviate[k].must + local_28,private_destructor);
        }
        free(dev->deviate[k].must);
        for (local_28 = 0; local_28 < (int)(uint)dev->deviate[k].unique_size;
            local_28 = local_28 + 1) {
          for (ctx._4_4_ = 0; ctx._4_4_ < (int)(uint)dev->deviate[k].unique[local_28].expr_size;
              ctx._4_4_ = ctx._4_4_ + 1) {
            lydict_remove(ctx_00,dev->deviate[k].unique[local_28].expr[ctx._4_4_]);
          }
          free(dev->deviate[k].unique[local_28].expr);
        }
        free(dev->deviate[k].unique);
      }
    }
    free(dev->deviate);
  }
  return;
}

Assistant:

static void
lys_deviation_free(struct lys_module *module, struct lys_deviation *dev,
                   void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i, j, k;
    struct ly_ctx *ctx;
    struct lys_node *next, *elem;

    ctx = module->ctx;

    lydict_remove(ctx, dev->target_name);
    lydict_remove(ctx, dev->dsc);
    lydict_remove(ctx, dev->ref);
    lys_extension_instances_free(ctx, dev->ext, dev->ext_size, private_destructor);

    if (!dev->deviate) {
        return;
    }

    /* it could not be applied because it failed to be applied */
    if (dev->orig_node) {
        /* the module was freed, but we only need the context from orig_node, use ours */
        if (dev->deviate[0].mod == LY_DEVIATE_NO) {
            /* it's actually a node subtree, we need to update modules on all the nodes :-/ */
            LY_TREE_DFS_BEGIN(dev->orig_node, next, elem) {
                elem->module = module;

                LY_TREE_DFS_END(dev->orig_node, next, elem);
            }
            lys_node_free(dev->orig_node, NULL, 0);
        } else {
            /* it's just a shallow copy, freeing one node */
            dev->orig_node->module = module;
            lys_node_free(dev->orig_node, NULL, 1);
        }
    }

    for (i = 0; i < dev->deviate_size; i++) {
        lys_extension_instances_free(ctx, dev->deviate[i].ext, dev->deviate[i].ext_size, private_destructor);

        for (j = 0; j < dev->deviate[i].dflt_size; j++) {
            lydict_remove(ctx, dev->deviate[i].dflt[j]);
        }
        free(dev->deviate[i].dflt);

        lydict_remove(ctx, dev->deviate[i].units);

        if (dev->deviate[i].mod == LY_DEVIATE_DEL) {
            for (j = 0; j < dev->deviate[i].must_size; j++) {
                lys_restr_free(ctx, &dev->deviate[i].must[j], private_destructor);
            }
            free(dev->deviate[i].must);

            for (j = 0; j < dev->deviate[i].unique_size; j++) {
                for (k = 0; k < dev->deviate[i].unique[j].expr_size; k++) {
                    lydict_remove(ctx, dev->deviate[i].unique[j].expr[k]);
                }
                free(dev->deviate[i].unique[j].expr);
            }
            free(dev->deviate[i].unique);
        }
    }
    free(dev->deviate);
}